

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<int,duckdb::TemplatedParquetValueConversion<long>,true,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  int *piVar1;
  ColumnReader *reader;
  ColumnReader *pCVar2;
  long lVar3;
  long in_RCX;
  long in_RDX;
  ColumnReader *in_RDI;
  ulong in_R8;
  idx_t row_idx;
  ValidityMask *result_mask;
  int *result_ptr;
  ulong local_48;
  
  piVar1 = FlatVector::GetData<int>((Vector *)0x59bea6);
  FlatVector::Validity((Vector *)0x59beb5);
  for (local_48 = in_R8; local_48 < in_R8 + in_RCX; local_48 = local_48 + 1) {
    reader = (ColumnReader *)(ulong)*(byte *)(in_RDX + local_48);
    pCVar2 = (ColumnReader *)MaxDefine(in_RDI);
    if (reader == pCVar2) {
      lVar3 = TemplatedParquetValueConversion<long>::PlainRead<true>((ByteBuffer *)in_RDI,reader);
      piVar1[local_48] = (int)lVar3;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)in_RDI,(idx_t)reader);
    }
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}